

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_result.cpp
# Opt level: O2

value __thiscall cpp_db::sqlite_result::get_column_value(sqlite_result *this,int column)

{
  undefined4 uVar1;
  int iVar2;
  sqlite3_stmt *psVar3;
  long lVar4;
  uchar *__first;
  undefined4 in_EDX;
  undefined8 extraout_RDX;
  _Storage extraout_RDX_00;
  _Storage extraout_RDX_01;
  _Storage extraout_RDX_02;
  _Storage _Var5;
  undefined4 in_register_00000034;
  element_type *peVar6;
  undefined1 auVar7 [16];
  value vVar8;
  allocator_type local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  psVar3 = get_stmt_handle((sqlite_result *)CONCAT44(in_register_00000034,column));
  uVar1 = sqlite3_column_type(psVar3,in_EDX);
  switch(uVar1) {
  case 1:
    auVar7 = sqlite3_column_int64(psVar3,in_EDX);
    (this->super_result_interface)._vptr_result_interface =
         (_func_int **)std::any::_Manager_internal<long>::_S_manage;
    goto LAB_00157920;
  case 2:
    peVar6 = (element_type *)sqlite3_column_double(psVar3,in_EDX);
    (this->super_result_interface)._vptr_result_interface =
         (_func_int **)std::any::_Manager_internal<double>::_S_manage;
    (this->stmt).super___shared_ptr<cpp_db::statement_interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = peVar6;
    _Var5 = extraout_RDX_02;
    break;
  case 3:
    lVar4 = sqlite3_column_text(psVar3,in_EDX);
    iVar2 = sqlite3_column_bytes(psVar3,in_EDX);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,lVar4,iVar2 + lVar4);
    std::any::
    any<std::__cxx11::string,std::__cxx11::string,std::any::_Manager_external<std::__cxx11::string>,void>
              ((any *)this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    _Var5 = extraout_RDX_00;
    break;
  case 4:
    __first = (uchar *)sqlite3_column_blob(psVar3,in_EDX);
    iVar2 = sqlite3_column_bytes(psVar3,in_EDX);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_40,__first,
               __first + iVar2,&local_41);
    std::any::
    any<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::any::_Manager_external<std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((any *)this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40);
    _Var5 = extraout_RDX_01;
    break;
  default:
    (this->super_result_interface)._vptr_result_interface =
         (_func_int **)std::any::_Manager_internal<cpp_db::null_type>::_S_manage;
    auVar7._8_8_ = extraout_RDX;
    auVar7._0_8_ = &void::typeinfo;
LAB_00157920:
    _Var5 = auVar7._8_8_;
    (this->stmt).super___shared_ptr<cpp_db::statement_interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = auVar7._0_8_;
  }
  vVar8._M_storage._M_ptr = _Var5._M_ptr;
  vVar8._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)this;
  return vVar8;
}

Assistant:

value sqlite_result::get_column_value(int column) const
{
	sqlite3_stmt *pstmt = get_stmt_handle();

    switch (sqlite3_column_type(pstmt, column))
    {
    case SQLITE_INTEGER:	// int64
        return static_cast<int64_t>(sqlite3_column_int64(pstmt, column));
    case SQLITE_FLOAT:		// double
        return sqlite3_column_double(pstmt, column);
    case SQLITE_BLOB:		// void *
    {
        const uint8_t *data = static_cast<const uint8_t*>(sqlite3_column_blob(pstmt, column));
        return blob(data, data + sqlite3_column_bytes(pstmt, column));
    }
    case SQLITE_TEXT:		// const char *
        return std::string(reinterpret_cast<const char *>(sqlite3_column_text(pstmt, column))
                           , static_cast<size_t>(sqlite3_column_bytes(pstmt, column)));
    case SQLITE_NULL:		//
    default:
        break;
    }
    return null_type();
}